

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O3

bool __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::OutputMultiLineText
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,
          OutputWriter *a_oOutput,Converter *a_oConverter,char *a_pText)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  char *pcVar4;
  
  pcVar4 = a_pText;
  if (*a_pText == '\0') {
    bVar3 = true;
  }
  else {
LAB_0020bceb:
    do {
      pcVar2 = pcVar4;
      pcVar4 = pcVar2 + 1;
      cVar1 = *pcVar2;
      if (cVar1 != '\0') {
        if (cVar1 != '\n') goto LAB_0020bceb;
      }
      *pcVar2 = '\0';
      bVar3 = Converter::ConvertToStore(a_oConverter,a_pText);
      if (!bVar3) {
        return bVar3;
      }
      *pcVar2 = cVar1;
      (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,(a_oConverter->m_scratch)._M_dataplus._M_p);
      (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
      a_pText = pcVar4;
    } while (cVar1 != '\0');
  }
  return bVar3;
}

Assistant:

bool
CSimpleIniTempl<SI_CHAR,SI_STRLESS,SI_CONVERTER>::OutputMultiLineText(
    OutputWriter &  a_oOutput,
    Converter &     a_oConverter,
    const SI_CHAR * a_pText
    ) const
{
    const SI_CHAR * pEndOfLine;
    SI_CHAR cEndOfLineChar = *a_pText;
    while (cEndOfLineChar) {
        // find the end of this line
        pEndOfLine = a_pText;
        for (; *pEndOfLine && *pEndOfLine != '\n'; ++pEndOfLine) /*loop*/ ;
        cEndOfLineChar = *pEndOfLine;

        // temporarily null terminate, convert and output the line
        *const_cast<SI_CHAR*>(pEndOfLine) = 0;
        if (!a_oConverter.ConvertToStore(a_pText)) {
            return false;
        }
        *const_cast<SI_CHAR*>(pEndOfLine) = cEndOfLineChar;
        a_pText += (pEndOfLine - a_pText) + 1;
        a_oOutput.Write(a_oConverter.Data());
        a_oOutput.Write(SI_NEWLINE_A);
    }
    return true;
}